

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O0

Vec_Int_t * Ssw_MatchingPairs(Aig_Man_t *p0,Aig_Man_t *p1)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  Aig_Obj_t *pObj;
  int local_34;
  int i;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Vec_Int_t *vPairsNew;
  Aig_Man_t *p1_local;
  Aig_Man_t *p0_local;
  
  iVar2 = Aig_ManCiNum(p0);
  iVar3 = Aig_ManCiNum(p1);
  if (iVar2 != iVar3) {
    __assert_fail("Aig_ManCiNum(p0) == Aig_ManCiNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswIslands.c"
                  ,0x152,"Vec_Int_t *Ssw_MatchingPairs(Aig_Man_t *, Aig_Man_t *)");
  }
  iVar2 = Aig_ManCoNum(p0);
  iVar3 = Aig_ManCoNum(p1);
  if (iVar2 != iVar3) {
    __assert_fail("Aig_ManCoNum(p0) == Aig_ManCoNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswIslands.c"
                  ,0x153,"Vec_Int_t *Ssw_MatchingPairs(Aig_Man_t *, Aig_Man_t *)");
  }
  iVar2 = Aig_ManRegNum(p0);
  iVar3 = Aig_ManRegNum(p1);
  if (iVar2 != iVar3) {
    __assert_fail("Aig_ManRegNum(p0) == Aig_ManRegNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswIslands.c"
                  ,0x154,"Vec_Int_t *Ssw_MatchingPairs(Aig_Man_t *, Aig_Man_t *)");
  }
  iVar2 = Aig_ManObjNum(p0);
  iVar3 = Aig_ManObjNum(p1);
  if (iVar2 == iVar3) {
    iVar2 = Aig_ManObjNum(p0);
    p = Vec_IntAlloc(iVar2 << 1);
    for (local_34 = 0; iVar2 = Vec_PtrSize(p0->vObjs), local_34 < iVar2; local_34 = local_34 + 1) {
      pObj = (Aig_Obj_t *)Vec_PtrEntry(p0->vObjs,local_34);
      if ((pObj != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsCo(pObj), iVar2 == 0)) {
        pvVar1 = (pObj->field_5).pData;
        Vec_IntPush(p,pObj->Id);
        Vec_IntPush(p,*(int *)((long)pvVar1 + 0x24));
      }
    }
    return p;
  }
  __assert_fail("Aig_ManObjNum(p0) == Aig_ManObjNum(p1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswIslands.c"
                ,0x155,"Vec_Int_t *Ssw_MatchingPairs(Aig_Man_t *, Aig_Man_t *)");
}

Assistant:

Vec_Int_t * Ssw_MatchingPairs( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Vec_Int_t * vPairsNew;
    Aig_Obj_t * pObj0, * pObj1;
    int i;
    // check correctness
    assert( Aig_ManCiNum(p0) == Aig_ManCiNum(p1) );
    assert( Aig_ManCoNum(p0) == Aig_ManCoNum(p1) );
    assert( Aig_ManRegNum(p0) == Aig_ManRegNum(p1) );
    assert( Aig_ManObjNum(p0) == Aig_ManObjNum(p1) );
    // create complete pairs
    vPairsNew = Vec_IntAlloc( 2*Aig_ManObjNum(p0) );
    Aig_ManForEachObj( p0, pObj0, i )
    {
        if ( Aig_ObjIsCo(pObj0) )
            continue;
        pObj1 = (Aig_Obj_t *)pObj0->pData;
        Vec_IntPush( vPairsNew, pObj0->Id );
        Vec_IntPush( vPairsNew, pObj1->Id );
    }
    return vPairsNew;
}